

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMModule.c
# Opt level: O1

cs_err ARM_global_init(cs_struct *ud)

{
  MCRegisterInfo *MRI;
  code *pcVar1;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  ARM_init(MRI);
  ARM_getRegName(ud,0);
  ud->printer = ARM_printInst;
  ud->printer_info = MRI;
  ud->reg_name = ARM_reg_name;
  ud->insn_id = ARM_get_insn_id;
  ud->insn_name = ARM_insn_name;
  ud->group_name = ARM_group_name;
  ud->post_printer = ARM_post_printer;
  ud->reg_access = ARM_reg_access;
  if ((ud->mode & CS_MODE_M680X_6801) == CS_MODE_ARM) {
    pcVar1 = ARM_getInstruction;
  }
  else {
    pcVar1 = Thumb_getInstruction;
  }
  ud->disasm = pcVar1;
  return CS_ERR_OK;
}

Assistant:

cs_err ARM_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	ARM_init(mri);
	ARM_getRegName(ud, 0);	// use default get_regname

	ud->printer = ARM_printInst;
	ud->printer_info = mri;
	ud->reg_name = ARM_reg_name;
	ud->insn_id = ARM_get_insn_id;
	ud->insn_name = ARM_insn_name;
	ud->group_name = ARM_group_name;
	ud->post_printer = ARM_post_printer;
#ifndef CAPSTONE_DIET
	ud->reg_access = ARM_reg_access;
#endif

	if (ud->mode & CS_MODE_THUMB)
		ud->disasm = Thumb_getInstruction;
	else
		ud->disasm = ARM_getInstruction;

	return CS_ERR_OK;
}